

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bimap.hpp
# Opt level: O0

void __thiscall
pstore::broker::
bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
::eraser<int>(bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
              *this,int *r2)

{
  bool bVar1;
  pointer ppVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a;
  _Self local_20;
  iterator it;
  int *r2_local;
  bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
  *this_local;
  
  it._M_node = (_Base_ptr)r2;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
       ::find(&this->right_,r2);
  a = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      end<std::map<int,std::__cxx11::string_const*,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string_const*>>>>
                (&this->right_);
  bVar1 = std::operator!=(&local_20,(_Self *)&a);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
             ::operator->(&local_20);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::erase(&this->left_,ppVar2->second);
    std::
    map<int,std::__cxx11::string_const*,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string_const*>>>
    ::erase_abi_cxx11_((map<int,std::__cxx11::string_const*,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string_const*>>>
                        *)&this->right_,(iterator)local_20._M_node);
  }
  return;
}

Assistant:

void bimap<L, R, Lcmp, Rcmp>::eraser (R2 const & r2) {
            auto it = right_.find (r2);
            if (it != std::end (right_)) {
                auto & a = *it->second;
                left_.erase (a);
                right_.erase (it);
            }
        }